

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O1

void __thiscall
DSFrame::DSFrame(DSFrame *this,PVideoFrame *src,VideoInfo vi,IScriptEnvironment *env)

{
  int iVar1;
  uchar **ppuVar2;
  int *piVar3;
  uchar *puVar4;
  code *pcVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  DSFormat local_4c;
  
  this->StrideBytes = (int *)0x0;
  this->DstPointers = (uchar **)0x0;
  this->FrameWidth = 0;
  this->FrameHeight = 0;
  this->SrcPointers = (uchar **)0x0;
  (this->Format).IsFamilyYUV = true;
  (this->Format).IsFamilyRGB = false;
  (this->Format).IsFamilyYCC = false;
  (this->Format).IsInteger = true;
  (this->Format).IsFloat = false;
  (this->Format).SSW = 0;
  (this->Format).SSH = 0;
  (this->Format).BitsPerSample = 8;
  (this->Format).BytesPerSample = 1;
  (this->Format).Planes = 3;
  this->_vssrc = (VSFrameRef *)0x0;
  this->_vsdst = (VSFrameRef *)0x0;
  this->_vscore = (VSCore *)0x0;
  this->_vsapi = (VSAPI *)0x0;
  this->_vsformat = (VSFormat *)0x0;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x3f8 < (uint)AVS_linkage->Size)) {
    pcVar5 = (code *)AVS_linkage->PVideoFrame_CONSTRUCTOR1;
    plVar6 = (long *)((long)this->planes_y + *(long *)&AVS_linkage->field_0x400 + -0x40);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    (*pcVar5)(plVar6,src);
  }
  (this->_vi).num_audio_samples = vi.num_audio_samples;
  (this->_vi).nchannels = vi.nchannels;
  (this->_vi).image_type = vi.image_type;
  (this->_vi).num_frames = vi.num_frames;
  (this->_vi).pixel_type = vi.pixel_type;
  (this->_vi).audio_samples_per_second = vi.audio_samples_per_second;
  (this->_vi).sample_type = vi.sample_type;
  (this->_vi).width = vi.width;
  (this->_vi).height = vi.height;
  (this->_vi).fps_numerator = vi.fps_numerator;
  (this->_vi).fps_denominator = vi.fps_denominator;
  this->_env = env;
  this->planes_y[0] = 1;
  this->planes_y[1] = 2;
  this->planes_y[2] = 4;
  this->planes_y[3] = 0x10;
  this->planes_r[0] = 0x20;
  this->planes_r[1] = 0x40;
  this->planes_r[2] = 0x80;
  this->planes_r[3] = 0x10;
  this->planes = (int *)0x0;
  if ((this->_avssrc).p != (VideoFrame *)0x0) {
    DSFormat::DSFormat(&local_4c,(this->_vi).pixel_type);
    (this->Format).SSH = local_4c.SSH;
    (this->Format).BitsPerSample = local_4c.BitsPerSample;
    (this->Format).BytesPerSample = local_4c.BytesPerSample;
    (this->Format).Planes = local_4c.Planes;
    (this->Format).IsFamilyYUV = local_4c.IsFamilyYUV;
    (this->Format).IsFamilyRGB = local_4c.IsFamilyRGB;
    (this->Format).IsFamilyYCC = local_4c.IsFamilyYCC;
    (this->Format).IsInteger = local_4c.IsInteger;
    (this->Format).IsFloat = local_4c.IsFloat;
    *(undefined3 *)&(this->Format).field_0x5 = local_4c._5_3_;
    (this->Format).SSW = local_4c.SSW;
    (this->Format).SSH = local_4c.SSH;
    piVar3 = this->planes_r;
    if ((this->Format).IsFamilyYUV != false) {
      piVar3 = this->planes_y;
    }
    this->planes = piVar3;
    iVar1 = (this->_vi).height;
    this->FrameWidth = (this->_vi).width;
    this->FrameHeight = iVar1;
    iVar1 = (this->Format).Planes;
    lVar8 = (long)iVar1;
    uVar7 = lVar8 * 8;
    if (lVar8 < 0) {
      uVar7 = 0xffffffffffffffff;
    }
    ppuVar2 = (uchar **)operator_new__(uVar7);
    uVar7 = lVar8 << 2;
    this->SrcPointers = ppuVar2;
    if (iVar1 < 0) {
      uVar7 = 0xffffffffffffffff;
    }
    piVar3 = (int *)operator_new__(uVar7);
    this->StrideBytes = piVar3;
    if (0 < (this->Format).Planes) {
      lVar8 = 0;
      do {
        if ((AVS_linkage == (AVS_Linkage *)0x0) || ((uint)AVS_linkage->Size < 0x349)) {
          puVar4 = (uchar *)0x0;
        }
        else {
          pcVar5 = (code *)AVS_linkage->VFGetReadPtr;
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *(long *)(src->p + *(long *)&AVS_linkage->field_0x350) + -1
                               );
          }
          puVar4 = (uchar *)(*pcVar5)(src->p + *(long *)&AVS_linkage->field_0x350,
                                      this->planes[lVar8]);
        }
        this->SrcPointers[lVar8] = puVar4;
        iVar1 = 0;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x2f8 < (uint)AVS_linkage->Size)) {
          pcVar5 = (code *)AVS_linkage->GetPitch;
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *(long *)(src->p + *(long *)&AVS_linkage->field_0x300) + -1
                               );
          }
          iVar1 = (*pcVar5)(src->p + *(long *)&AVS_linkage->field_0x300,this->planes[lVar8]);
        }
        this->StrideBytes[lVar8] = iVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->Format).Planes);
    }
  }
  return;
}

Assistant:

DSFrame(PVideoFrame &src, VideoInfo vi, IScriptEnvironment * env)
    : _avssrc(src), _vi(vi), _env(env)
  {
    if (_avssrc) {
      Format = DSFormat(_vi.pixel_type);
      planes = Format.IsFamilyYUV ? planes_y : planes_r;
      FrameWidth = _vi.width;
      FrameHeight = _vi.height;

      SrcPointers = new const unsigned char*[Format.Planes];
      StrideBytes = new int[Format.Planes];
      for (int i = 0; i < Format.Planes; i++) {
        SrcPointers[i] = src->GetReadPtr(planes[i]);
        StrideBytes[i] = src->GetPitch(planes[i]);
      }
    }
  }